

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

int Vec_IntPushUniqueOrder(Vec_Int_t *p,int Entry)

{
  int *piVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int nCapMin;
  
  uVar2 = p->nSize;
  piVar3 = (int *)(ulong)uVar2;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  while (uVar5 != uVar6) {
    piVar1 = p->pArray + uVar6;
    uVar6 = uVar6 + 1;
    if (*piVar1 == Entry) goto LAB_006d86b3;
  }
  if (uVar2 == p->nCap) {
    nCapMin = 0x10;
    if (0xf < (int)uVar2) {
      nCapMin = uVar2 * 2;
    }
    Vec_IntGrow(p,nCapMin);
    uVar2 = p->nSize;
  }
  p->nSize = uVar2 + 1;
  piVar3 = p->pArray;
  for (uVar6 = (ulong)uVar2;
      (uVar4 = (int)uVar2 >> 0x1f & uVar2, 0 < (int)(uint)uVar6 &&
      (uVar4 = (uint)uVar6, Entry < piVar3[uVar6 - 1])); uVar6 = uVar6 - 1) {
    piVar3[uVar6] = piVar3[uVar6 - 1];
  }
  piVar3[(int)uVar4] = Entry;
LAB_006d86b3:
  return (int)piVar3;
}

Assistant:

static inline int Vec_IntPushUniqueOrder( Vec_Int_t * p, int Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            return 1;
    Vec_IntPushOrder( p, Entry );
    return 0;
}